

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O2

EStatusCode __thiscall
AbstractContentContext::Do(AbstractContentContext *this,string *inXObjectName)

{
  EStatusCode EVar1;
  allocator<char> local_39;
  string local_38;
  
  EVar1 = (*this->_vptr_AbstractContentContext[5])();
  if (EVar1 != eSuccess) {
    this->mCurrentStatusCode = EVar1;
  }
  AssertProcsetAvailable(this,&KProcsetPDF_abi_cxx11_);
  PrimitiveObjectsWriter::WriteName(&this->mPrimitiveWriter,inXObjectName,eTokenSeparatorSpace);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Do",&local_39);
  PrimitiveObjectsWriter::WriteKeyword(&this->mPrimitiveWriter,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return this->mCurrentStatusCode;
}

Assistant:

EStatusCode AbstractContentContext::Do(const std::string& inXObjectName)
{
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);

	mPrimitiveWriter.WriteName(inXObjectName);	
	mPrimitiveWriter.WriteKeyword("Do");	
	return GetCurrentStatusCode();
}